

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O2

void secp256k1_scalar_to_signed62(secp256k1_modinv64_signed62 *r,secp256k1_scalar *a)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = a->d[0];
  uVar2 = a->d[1];
  uVar3 = a->d[2];
  uVar4 = a->d[3];
  r->v[0] = uVar1 & 0x3fffffffffffffff;
  r->v[1] = (uVar2 & 0xfffffffffffffff) << 2 | uVar1 >> 0x3e;
  r->v[2] = (uVar3 & 0x3ffffffffffffff) << 4 | uVar2 >> 0x3c;
  r->v[3] = (uVar4 & 0xffffffffffffff) << 6 | uVar3 >> 0x3a;
  r->v[4] = uVar4 >> 0x38;
  return;
}

Assistant:

static void secp256k1_scalar_to_signed62(secp256k1_modinv64_signed62 *r, const secp256k1_scalar *a) {
    const uint64_t M62 = UINT64_MAX >> 2;
    const uint64_t a0 = a->d[0], a1 = a->d[1], a2 = a->d[2], a3 = a->d[3];
    SECP256K1_SCALAR_VERIFY(a);

    r->v[0] =  a0                   & M62;
    r->v[1] = (a0 >> 62 | a1 <<  2) & M62;
    r->v[2] = (a1 >> 60 | a2 <<  4) & M62;
    r->v[3] = (a2 >> 58 | a3 <<  6) & M62;
    r->v[4] =  a3 >> 56;
}